

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

bool deqp::gls::BuiltinPrecisionTests::contains<tcu::Matrix<float,2,2>>
               (IVal *ival,Matrix<float,_2,_2> *value)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  
  bVar2 = ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doContains
                    ((IVal *)ival,(Vector<float,_2> *)value);
  if (bVar2) {
    bVar1 = false;
    do {
      bVar2 = bVar1;
      if (bVar2) {
        return bVar2;
      }
      bVar3 = ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doContains
                        ((ival->m_data).m_data + 1,(value->m_data).m_data + 1);
      bVar1 = true;
    } while (bVar3);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool contains (const typename Traits<T>::IVal& ival, const T& value)
{
	return Traits<T>::doContains(ival, value);
}